

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O0

void __thiscall
bf_crc::set_parameters
          (bf_crc *this,uint16_t crc_width,uint32_t polynomial,bool probe_final_xor,
          uint32_t final_xor,bool probe_initial,uint32_t initial,bool probe_reflected_input,
          bool probe_reflected_output,FEED_TYPE feed_type)

{
  undefined4 in_EDX;
  bf_crc *in_RDI;
  uint32_t in_R8D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_ffffffffffffffcc;
  undefined1 var;
  undefined4 in_stack_ffffffffffffffd0;
  
  set_crc_width((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
                (uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
  set_polynomial((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  var = (undefined1)(in_stack_ffffffffffffffcc >> 0x18);
  set_probe_final_xor((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(bool)var);
  set_final_xor(in_RDI,in_R8D);
  set_probe_initial((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(bool)var);
  set_initial(in_RDI,in_stack_00000008);
  set_probe_reflected_input((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(bool)var);
  set_probe_reflected_output((bf_crc *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(bool)var);
  set_feed_type(in_RDI,final_xor);
  return;
}

Assistant:

void set_parameters(	uint16_t crc_width, 
								uint32_t polynomial, 
								bool probe_final_xor, 
								uint32_t final_xor, 
								bool probe_initial, 
								uint32_t initial, 
								bool probe_reflected_input, 
					bool probe_reflected_output,
					my_crc_basic::FEED_TYPE feed_type)
		{
			set_crc_width(crc_width);
			set_polynomial(polynomial);
			set_probe_final_xor(probe_final_xor);
			set_final_xor(final_xor);
			set_probe_initial(probe_initial);
			set_initial(initial);
			set_probe_reflected_input(probe_reflected_input);
			set_probe_reflected_output(probe_reflected_output);
			set_feed_type(feed_type);
		}